

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O2

bool __thiscall slang::ast::Type::implements(Type *this,Type *ifaceClass)

{
  bool bVar1;
  ClassType *this_00;
  long lVar2;
  bool bVar3;
  span<const_slang::ast::Type_*const,_18446744073709551615UL> sVar4;
  
  this_00 = (ClassType *)getCanonicalType(this);
  bVar1 = isClass((Type *)this_00);
  if (bVar1) {
    sVar4 = ClassType::getImplementedInterfaces(this_00);
    lVar2 = 0;
    do {
      bVar3 = sVar4._M_extent._M_extent_value._M_extent_value << 3 == lVar2;
      bVar1 = !bVar3;
      if (bVar3) {
        return bVar1;
      }
      bVar3 = isMatching(*(Type **)((long)sVar4._M_ptr + lVar2),ifaceClass);
      lVar2 = lVar2 + 8;
    } while (!bVar3);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Type::implements(const Type& ifaceClass) const {
    const Type* c = &getCanonicalType();
    if (!c->isClass())
        return false;

    for (auto iface : c->as<ClassType>().getImplementedInterfaces()) {
        if (iface->isMatching(ifaceClass))
            return true;
    }

    return false;
}